

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O3

void RegexTree::lastpos(tree_node *ptr,StateSet *s)

{
  char cVar1;
  bool bVar2;
  __hashtable *__h;
  tree_node *ptVar3;
  tree_node *ptr_00;
  __node_gen_type __node_gen;
  tree_node *local_28;
  StateSet *local_20;
  
  if (ptr == (tree_node *)0x0) {
    return;
  }
  cVar1 = ptr->c;
  if (cVar1 == '\a') {
    return;
  }
  local_28 = ptr;
  if ((ptr->left == (tree_node *)0x0) && (ptr->right == (tree_node *)0x0)) {
    local_20 = s;
    std::
    _Hashtable<tree_node_const*,tree_node_const*,std::allocator<tree_node_const*>,std::__detail::_Identity,std::equal_to<tree_node_const*>,std::hash<tree_node_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<tree_node_const*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<tree_node_const*,false>>>>
              ((_Hashtable<tree_node_const*,tree_node_const*,std::allocator<tree_node_const*>,std::__detail::_Identity,std::equal_to<tree_node_const*>,std::hash<tree_node_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)s,&local_28);
    cVar1 = local_28->c;
  }
  ptVar3 = local_28;
  if (cVar1 == '\b') {
    ptr_00 = local_28->right;
    bVar2 = nullable(ptr_00);
    if (!bVar2) goto LAB_00103a98;
LAB_00103a82:
    lastpos(ptVar3->left,s);
    ptVar3 = (tree_node *)&local_28->right;
  }
  else if (cVar1 != '\t') {
    if (cVar1 != '\n') {
      return;
    }
    goto LAB_00103a82;
  }
  ptr_00 = ptVar3->left;
LAB_00103a98:
  lastpos(ptr_00,s);
  return;
}

Assistant:

void RegexTree::lastpos(const tree_node *ptr, RegexTree::StateSet &s) {
    if (ptr == nullptr || ptr->c == EPSILON) return;
    if (ptr->left == nullptr && ptr->right == nullptr)
        s.insert(ptr);
    if (ptr->c == OR) {
        lastpos(ptr->left, s);
        lastpos(ptr->right, s);
        return;
    }
    if (ptr->c == CAT) {
        if (nullable(ptr->right)) {
            lastpos(ptr->left, s);
            lastpos(ptr->right, s);
        } else
            lastpos(ptr->right, s);
        return;
    }
    if (ptr->c == STAR)
        lastpos(ptr->left, s);
}